

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O3

void __thiscall State::State(State *this,int w,int h)

{
  undefined1 auVar1 [16];
  int iVar2;
  int *__first;
  ulong uVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  State local_50;
  long lVar7;
  
  iVar2 = h * w;
  lVar4 = (long)iVar2;
  uVar3 = 0xffffffffffffffff;
  if (-1 < iVar2) {
    uVar3 = lVar4 * 4;
  }
  __first = (int *)operator_new__(uVar3);
  auVar1 = _DAT_001061f0;
  if (0 < iVar2) {
    lVar7 = lVar4 + -1;
    auVar5._8_4_ = (int)lVar7;
    auVar5._0_8_ = lVar7;
    auVar5._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar3 = 0;
    auVar5 = auVar5 ^ _DAT_001061f0;
    auVar6 = _DAT_001061e0;
    do {
      auVar8 = auVar6 ^ auVar1;
      if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                  auVar5._4_4_ < auVar8._4_4_) & 1)) {
        __first[uVar3] = (int)uVar3;
      }
      if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
          auVar8._12_4_ <= auVar5._12_4_) {
        __first[uVar3 + 1] = (int)uVar3 + 1;
      }
      uVar3 = uVar3 + 2;
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
    } while ((iVar2 + 1U & 0xfffffffe) != uVar3);
  }
  uVar3 = std::chrono::_V2::system_clock::now();
  local_50.tiles = (int **)(uVar3 % 0x7fffffff + (ulong)(uVar3 % 0x7fffffff == 0));
  std::shuffle<int*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            (__first,__first + lVar4,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_50);
  State(&local_50,w,h,__first);
  operator=(this,&local_50);
  if (local_50.tiles != (int **)0x0) {
    operator_delete__(local_50.tiles);
  }
  operator_delete__(__first);
  return;
}

Assistant:

State::State(int w, int h) {
    auto numbers = new int[w * h];
    for (int i = 0; i < w * h; i++) {
        numbers[i] = i;
    }

    long seed = std::chrono::high_resolution_clock::now().time_since_epoch().count();
    std::shuffle(&numbers[0], &numbers[w * h], std::default_random_engine(seed));

    *this = State(w, h, numbers);
    delete[] numbers;
}